

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O1

void __thiscall
ExprAssignment::ExprAssignment
          (ExprAssignment *this,SynBase *source,TypeBase *type,ExprBase *lhs,ExprBase *rhs)

{
  TypeBase *pTVar1;
  
  (this->super_ExprBase).typeID = 0x19;
  (this->super_ExprBase).source = source;
  (this->super_ExprBase).type = type;
  (this->super_ExprBase).next = (ExprBase *)0x0;
  (this->super_ExprBase).listed = false;
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6590;
  this->lhs = lhs;
  this->rhs = rhs;
  if ((type == (TypeBase *)0x0) || (type->typeID != 0)) {
    pTVar1 = lhs->type;
    if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
      pTVar1 = (TypeBase *)0x0;
    }
    if (pTVar1 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x32e,
                    "ExprAssignment::ExprAssignment(SynBase *, TypeBase *, ExprBase *, ExprBase *)")
      ;
    }
    if ((TypeBase *)pTVar1[1]._vptr_TypeBase != rhs->type) {
      __assert_fail("refType->subType == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x32f,
                    "ExprAssignment::ExprAssignment(SynBase *, TypeBase *, ExprBase *, ExprBase *)")
      ;
    }
  }
  return;
}

Assistant:

ExprAssignment(SynBase *source, TypeBase *type, ExprBase *lhs, ExprBase *rhs): ExprBase(myTypeID, source, type), lhs(lhs), rhs(rhs)
	{
		if(!isType<TypeError>(type))
		{
			TypeRef *refType = getType<TypeRef>(lhs->type);

			(void)refType;
			assert(refType);
			assert(refType->subType == rhs->type);
		}
	}